

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

optional<metaf::WindGroup> *
metaf::WindGroup::parseVariableSector
          (optional<metaf::WindGroup> *__return_storage_ptr__,string *group)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  Direction unaff_R12;
  smatch match;
  string_type local_68;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_48;
  
  if ((parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseVariableSector(std::__cxx11::string_const&)::
                                   varWindRgx_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,
               "(\\d\\d0)V(\\d\\d0)",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_);
  }
  local_48.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_begin._M_current = (char *)0x0;
  local_48.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (group->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + group->_M_string_length),&local_48,
                     &parseVariableSector(std::__cxx11::string_const&)::varWindRgx_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_68,&local_48,1);
    if (local_68._M_string_length == 3) {
      iVar2 = std::__cxx11::string::compare((char *)&local_68);
      if (iVar2 == 0) {
        group._0_4_ = 0;
        group._4_4_ = NOT_REPORTED;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar2 == 0) {
          group._0_4_ = 0;
          group._4_4_ = VARIABLE;
        }
        else {
          bVar1 = false;
          if (local_68._M_dataplus._M_p[2] != '0') goto LAB_001a6b11;
          if (local_68._M_string_length < 3) goto LAB_001a6b25;
          lVar3 = 0;
          uVar4 = 0;
          do {
            if (9 < (byte)(local_68._M_dataplus._M_p[lVar3] - 0x30U)) goto LAB_001a6b11;
            uVar4 = (uint)(byte)(local_68._M_dataplus._M_p[lVar3] - 0x30U) + uVar4 * 10;
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 != 3);
          group = (string *)((ulong)uVar4 | 0x300000000);
        }
      }
      bVar1 = true;
    }
    else {
LAB_001a6b11:
      bVar1 = false;
    }
LAB_001a6b25:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_68,&local_48,2);
      if (local_68._M_string_length == 3) {
        iVar2 = std::__cxx11::string::compare((char *)&local_68);
        if (iVar2 == 0) {
          unaff_R12.dirDegrees = 0;
          unaff_R12.dirType = NOT_REPORTED;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_68);
          if (iVar2 == 0) {
            unaff_R12.dirDegrees = 0;
            unaff_R12.dirType = VARIABLE;
          }
          else {
            bVar1 = false;
            if (local_68._M_dataplus._M_p[2] != '0') goto LAB_001a6bd4;
            if (local_68._M_string_length < 3) goto LAB_001a6be8;
            lVar3 = 0;
            uVar4 = 0;
            do {
              if (9 < (byte)(local_68._M_dataplus._M_p[lVar3] - 0x30U)) goto LAB_001a6bd4;
              uVar4 = (uint)(byte)(local_68._M_dataplus._M_p[lVar3] - 0x30U) + uVar4 * 10;
              lVar3 = lVar3 + 1;
            } while ((int)lVar3 != 3);
            unaff_R12 = (Direction)((ulong)uVar4 | 0x300000000);
          }
        }
        bVar1 = true;
      }
      else {
LAB_001a6bd4:
        bVar1 = false;
      }
LAB_001a6be8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (bVar1) {
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload = 2;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType =
             NOT_REPORTED;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x10) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedUnit = KNOTS;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x1c) = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
          super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x2c) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wShHeight.distUnit =
             METERS;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin =
             (Direction)group;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd = unaff_R12;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x54) = 0;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x60) = 0;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.incompleteText = NONE;
        (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
        super__Optional_payload_base<metaf::WindGroup>._M_engaged = true;
        goto LAB_001a6c5b;
      }
    }
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
           super__Optional_base<metaf::Runway,_true,_true>._M_payload + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 100) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x50) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.rw.
  super__Optional_base<metaf::Runway,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Runway>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecEnd.dirType = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x48) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x30) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.vsecBegin.dirType = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedUnit = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload + 0x28) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.wSpeed.speedValue.
           super__Optional_base<unsigned_int,_true,_true> + 4) = 0;
  (__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.gSpeed.speedValue.
  super__Optional_base<unsigned_int,_true,_true>._M_payload =
       (_Optional_payload<unsigned_int,_true,_true,_true>)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::WindGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::WindGroup>._M_payload._M_value.windDir.dirType = 0;
LAB_001a6c5b:
  if (local_48.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<WindGroup> WindGroup::parseVariableSector(const std::string & group) {
	static const std::optional<WindGroup> notRecognised;
	static const std::regex varWindRgx("(\\d\\d0)V(\\d\\d0)");
	static const auto matchVarWindBegin = 1, matchVarWindEnd = 2;

	std::smatch match; 
	if (!std::regex_match(group, match, varWindRgx)) return notRecognised; 
	WindGroup result;
	const auto begin = Direction::fromDegreesString(match.str(matchVarWindBegin));
	if (!begin.has_value()) return notRecognised;
	result.vsecBegin = *begin;
	const auto end = Direction::fromDegreesString(match.str(matchVarWindEnd));
	if (!end.has_value()) return notRecognised;
	result.vsecEnd = *end;
	result.windType = Type::VARIABLE_WIND_SECTOR;
	return result;
}